

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::add_hom_clique_non_edge
          (Proof *this,NamedVertex *pp,NamedVertex *tt,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *p_clique,NamedVertex *t,NamedVertex *u)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar6;
  size_t __n;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var7;
  NamedVertex *__b;
  int iVar8;
  ostream *poVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  mapped_type *pmVar11;
  pointer __a;
  pointer __a_00;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  pair<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  NamedVertex *local_68;
  NamedVertex *local_60;
  pointer local_58;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_50;
  NamedVertex *local_48;
  NamedVertex *local_40;
  pointer local_38;
  
  uVar6._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  local_48 = pp;
  local_40 = tt;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar6._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"* hom clique non edges for ",0x1b);
  local_68 = t;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar6._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(t->second)._M_dataplus._M_p,(t->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  local_60 = u;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(u->second)._M_dataplus._M_p,(u->second)._M_string_length);
  local_108.first.first.first._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_108,1);
  local_58 = (p_clique->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __a_00 = (p_clique->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (__a_00 != local_58) {
    paVar10 = &local_108.second.second.second.field_2;
    local_50 = p_clique;
    do {
      __a = (local_50->
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      local_38 = (local_50->
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (__a != local_38) {
        do {
          if ((__a_00->first == __a->first) &&
             (__n = (__a_00->second)._M_string_length, __n == (__a->second)._M_string_length)) {
            if (__n != 0) {
              iVar8 = bcmp((__a_00->second)._M_dataplus._M_p,(__a->second)._M_dataplus._M_p,__n);
              if (iVar8 != 0) goto LAB_00152552;
            }
          }
          else {
LAB_00152552:
            uVar6._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       uVar6._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl,"u 1 ~x",6);
            local_108.first.first._0_8_ = SEXT48(local_48->first);
            local_108.first.first.second._M_dataplus._M_p = (pointer)(long)local_40->first;
            pmVar11 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)&local_108);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)
                                uVar6._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl,(pmVar11->_M_dataplus)._M_p,pmVar11->_M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," 1 ~x",5);
            local_158.first._0_8_ = SEXT48(__a_00->first);
            local_158.first.second._M_dataplus._M_p = (pointer)(long)local_68->first;
            pmVar11 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)&local_158);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(pmVar11->_M_dataplus)._M_p,pmVar11->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," 1 ~x",5);
            __b = local_60;
            local_1a8.first._0_8_ = SEXT48(__a->first);
            local_1a8.first.second._M_dataplus._M_p = (pointer)(long)local_60->first;
            pmVar11 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)&local_1a8);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(pmVar11->_M_dataplus)._M_p,pmVar11->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," >= 1 ;\n",8);
            _Var7._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            plVar1 = &(_Var7._M_head_impl)->proof_line;
            *plVar1 = *plVar1 + 1;
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      (&local_158,__a_00,local_68);
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      (&local_1a8,__a,__b);
            local_108.first.second.second._M_string_length =
                 local_158.second.second._M_string_length;
            local_108.first.first.second._M_string_length = local_158.first.second._M_string_length;
            local_108.second.second.second._M_string_length =
                 local_1a8.second.second._M_string_length;
            local_108.second.first.second._M_string_length = local_1a8.first.second._M_string_length
            ;
            local_108.first.first.second._M_dataplus._M_p =
                 (pointer)&local_108.first.first.second.field_2;
            paVar2 = &local_158.first.second.field_2;
            local_108.first.first.first = local_158.first.first;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.first.second._M_dataplus._M_p == paVar2) {
              local_108.first.first.second.field_2._8_8_ = local_158.first.second.field_2._8_8_;
            }
            else {
              local_108.first.first.second._M_dataplus._M_p =
                   local_158.first.second._M_dataplus._M_p;
            }
            local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                 local_158.first.second.field_2._M_allocated_capacity._1_7_;
            local_108.first.first.second.field_2._M_local_buf[0] =
                 local_158.first.second.field_2._M_local_buf[0];
            local_158.first.second._M_string_length = 0;
            local_158.first.second.field_2._M_local_buf[0] = '\0';
            local_108.first.second.second._M_dataplus._M_p =
                 (pointer)&local_108.first.second.second.field_2;
            paVar5 = &local_158.second.second.field_2;
            local_108.second.first.second._M_dataplus._M_p =
                 (pointer)&local_108.second.first.second.field_2;
            local_108.first.second.first = local_158.second.first;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.second.second._M_dataplus._M_p == paVar5) {
              local_108.first.second.second.field_2._8_8_ = local_158.second.second.field_2._8_8_;
            }
            else {
              local_108.first.second.second._M_dataplus._M_p =
                   local_158.second.second._M_dataplus._M_p;
            }
            local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                 local_158.second.second.field_2._M_allocated_capacity._1_7_;
            local_108.first.second.second.field_2._M_local_buf[0] =
                 local_158.second.second.field_2._M_local_buf[0];
            local_158.second.second._M_string_length = 0;
            local_158.second.second.field_2._M_local_buf[0] = '\0';
            local_108.second.first.first = local_1a8.first.first;
            paVar3 = &local_1a8.first.second.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.first.second._M_dataplus._M_p == paVar3) {
              local_108.second.first.second.field_2._8_8_ = local_1a8.first.second.field_2._8_8_;
            }
            else {
              local_108.second.first.second._M_dataplus._M_p =
                   local_1a8.first.second._M_dataplus._M_p;
            }
            local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                 local_1a8.first.second.field_2._M_allocated_capacity._1_7_;
            local_108.second.first.second.field_2._M_local_buf[0] =
                 local_1a8.first.second.field_2._M_local_buf[0];
            local_1a8.first.second._M_string_length = 0;
            local_1a8.first.second.field_2._M_local_buf[0] = '\0';
            local_108.second.second.first = local_1a8.second.first;
            paVar4 = &local_1a8.second.second.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.second.second._M_dataplus._M_p == paVar4) {
              local_108.second.second.second.field_2._8_8_ = local_1a8.second.second.field_2._8_8_;
              local_108.second.second.second._M_dataplus._M_p = (pointer)paVar10;
            }
            else {
              local_108.second.second.second._M_dataplus._M_p =
                   local_1a8.second.second._M_dataplus._M_p;
            }
            local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                 local_1a8.second.second.field_2._M_allocated_capacity._1_7_;
            local_108.second.second.second.field_2._M_local_buf[0] =
                 local_1a8.second.second.field_2._M_local_buf[0];
            local_1a8.second.second._M_string_length = 0;
            local_1a8.second.second.field_2._M_local_buf[0] = '\0';
            local_1a8.first.second._M_dataplus._M_p = (pointer)paVar3;
            local_1a8.second.second._M_dataplus._M_p = (pointer)paVar4;
            local_158.first.second._M_dataplus._M_p = (pointer)paVar2;
            local_158.second.second._M_dataplus._M_p = (pointer)paVar5;
            std::
            _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
            ::
            _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                      ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                        *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                       &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        proof_line);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.second.second.second._M_dataplus._M_p != paVar10) {
              operator_delete(local_108.second.second.second._M_dataplus._M_p,
                              local_108.second.second.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.second.first.second._M_dataplus._M_p !=
                &local_108.second.first.second.field_2) {
              operator_delete(local_108.second.first.second._M_dataplus._M_p,
                              local_108.second.first.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.first.second.second._M_dataplus._M_p !=
                &local_108.first.second.second.field_2) {
              operator_delete(local_108.first.second.second._M_dataplus._M_p,
                              local_108.first.second.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.first.first.second._M_dataplus._M_p !=
                &local_108.first.first.second.field_2) {
              operator_delete(local_108.first.first.second._M_dataplus._M_p,
                              local_108.first.first.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.second.second._M_dataplus._M_p != &local_1a8.second.second.field_2) {
              operator_delete(local_1a8.second.second._M_dataplus._M_p,
                              CONCAT71(local_1a8.second.second.field_2._M_allocated_capacity._1_7_,
                                       local_1a8.second.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.first.second._M_dataplus._M_p != &local_1a8.first.second.field_2) {
              operator_delete(local_1a8.first.second._M_dataplus._M_p,
                              CONCAT71(local_1a8.first.second.field_2._M_allocated_capacity._1_7_,
                                       local_1a8.first.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.second.second._M_dataplus._M_p != &local_158.second.second.field_2) {
              operator_delete(local_158.second.second._M_dataplus._M_p,
                              CONCAT71(local_158.second.second.field_2._M_allocated_capacity._1_7_,
                                       local_158.second.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.first.second._M_dataplus._M_p != paVar2) {
              operator_delete(local_158.first.second._M_dataplus._M_p,
                              CONCAT71(local_158.first.second.field_2._M_allocated_capacity._1_7_,
                                       local_158.first.second.field_2._M_local_buf[0]) + 1);
            }
            _Var7._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      (&local_158,__a,local_60);
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      (&local_1a8,__a_00,local_68);
            local_108.first.second.second._M_string_length =
                 local_158.second.second._M_string_length;
            local_108.first.first.second._M_string_length = local_158.first.second._M_string_length;
            local_108.second.second.second._M_string_length =
                 local_1a8.second.second._M_string_length;
            local_108.second.first.second._M_string_length = local_1a8.first.second._M_string_length
            ;
            local_108.first.first.second._M_dataplus._M_p =
                 (pointer)&local_108.first.first.second.field_2;
            local_108.first.first.first = local_158.first.first;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.first.second._M_dataplus._M_p == paVar2) {
              local_108.first.first.second.field_2._8_8_ = local_158.first.second.field_2._8_8_;
            }
            else {
              local_108.first.first.second._M_dataplus._M_p =
                   local_158.first.second._M_dataplus._M_p;
            }
            local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                 local_158.first.second.field_2._M_allocated_capacity._1_7_;
            local_108.first.first.second.field_2._M_local_buf[0] =
                 local_158.first.second.field_2._M_local_buf[0];
            local_158.first.second._M_string_length = 0;
            local_158.first.second.field_2._M_local_buf[0] = '\0';
            local_108.first.second.second._M_dataplus._M_p =
                 (pointer)&local_108.first.second.second.field_2;
            paVar3 = &local_158.second.second.field_2;
            local_108.second.first.second._M_dataplus._M_p =
                 (pointer)&local_108.second.first.second.field_2;
            paVar5 = &local_1a8.second.second.field_2;
            local_108.first.second.first = local_158.second.first;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.second.second._M_dataplus._M_p == paVar3) {
              local_108.first.second.second.field_2._8_8_ = local_158.second.second.field_2._8_8_;
            }
            else {
              local_108.first.second.second._M_dataplus._M_p =
                   local_158.second.second._M_dataplus._M_p;
            }
            local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                 local_158.second.second.field_2._M_allocated_capacity._1_7_;
            local_108.first.second.second.field_2._M_local_buf[0] =
                 local_158.second.second.field_2._M_local_buf[0];
            local_158.second.second._M_string_length = 0;
            local_158.second.second.field_2._M_local_buf[0] = '\0';
            local_108.second.first.first = local_1a8.first.first;
            paVar4 = &local_1a8.first.second.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.first.second._M_dataplus._M_p == paVar4) {
              local_108.second.first.second.field_2._8_8_ = local_1a8.first.second.field_2._8_8_;
            }
            else {
              local_108.second.first.second._M_dataplus._M_p =
                   local_1a8.first.second._M_dataplus._M_p;
            }
            local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                 local_1a8.first.second.field_2._M_allocated_capacity._1_7_;
            local_108.second.first.second.field_2._M_local_buf[0] =
                 local_1a8.first.second.field_2._M_local_buf[0];
            local_1a8.first.second._M_string_length = 0;
            local_1a8.first.second.field_2._M_local_buf[0] = '\0';
            local_108.second.second.first = local_1a8.second.first;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.second.second._M_dataplus._M_p == paVar5) {
              local_108.second.second.second.field_2._8_8_ = local_1a8.second.second.field_2._8_8_;
              local_108.second.second.second._M_dataplus._M_p = (pointer)paVar10;
            }
            else {
              local_108.second.second.second._M_dataplus._M_p =
                   local_1a8.second.second._M_dataplus._M_p;
            }
            local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                 local_1a8.second.second.field_2._M_allocated_capacity._1_7_;
            local_108.second.second.second.field_2._M_local_buf[0] =
                 local_1a8.second.second.field_2._M_local_buf[0];
            local_1a8.second.second._M_string_length = 0;
            local_1a8.second.second.field_2._M_local_buf[0] = '\0';
            local_1a8.first.second._M_dataplus._M_p = (pointer)paVar4;
            local_1a8.second.second._M_dataplus._M_p = (pointer)paVar5;
            local_158.first.second._M_dataplus._M_p = (pointer)paVar2;
            local_158.second.second._M_dataplus._M_p = (pointer)paVar3;
            std::
            _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
            ::
            _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                      ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                        *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                       &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        proof_line);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.second.second.second._M_dataplus._M_p != paVar10) {
              operator_delete(local_108.second.second.second._M_dataplus._M_p,
                              local_108.second.second.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.second.first.second._M_dataplus._M_p !=
                &local_108.second.first.second.field_2) {
              operator_delete(local_108.second.first.second._M_dataplus._M_p,
                              local_108.second.first.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.first.second.second._M_dataplus._M_p !=
                &local_108.first.second.second.field_2) {
              operator_delete(local_108.first.second.second._M_dataplus._M_p,
                              local_108.first.second.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.first.first.second._M_dataplus._M_p !=
                &local_108.first.first.second.field_2) {
              operator_delete(local_108.first.first.second._M_dataplus._M_p,
                              local_108.first.first.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.second.second._M_dataplus._M_p != &local_1a8.second.second.field_2) {
              operator_delete(local_1a8.second.second._M_dataplus._M_p,
                              CONCAT71(local_1a8.second.second.field_2._M_allocated_capacity._1_7_,
                                       local_1a8.second.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8.first.second._M_dataplus._M_p != &local_1a8.first.second.field_2) {
              operator_delete(local_1a8.first.second._M_dataplus._M_p,
                              CONCAT71(local_1a8.first.second.field_2._M_allocated_capacity._1_7_,
                                       local_1a8.first.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.second.second._M_dataplus._M_p != &local_158.second.second.field_2) {
              operator_delete(local_158.second.second._M_dataplus._M_p,
                              CONCAT71(local_158.second.second.field_2._M_allocated_capacity._1_7_,
                                       local_158.second.second.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158.first.second._M_dataplus._M_p != paVar2) {
              operator_delete(local_158.first.second._M_dataplus._M_p,
                              CONCAT71(local_158.first.second.field_2._M_allocated_capacity._1_7_,
                                       local_158.first.second.field_2._M_local_buf[0]) + 1);
            }
          }
          __a = __a + 1;
        } while (__a != local_38);
      }
      __a_00 = __a_00 + 1;
    } while (__a_00 != local_58);
  }
  return;
}

Assistant:

auto Proof::add_hom_clique_non_edge(
    const NamedVertex & pp,
    const NamedVertex & tt,
    const std::vector<NamedVertex> & p_clique,
    const NamedVertex & t,
    const NamedVertex & u) -> void
{
    *_imp->proof_stream << "* hom clique non edges for " << t.second << " " << u.second << '\n';
    for (auto & p : p_clique) {
        for (auto & q : p_clique) {
            if (p != q) {
                *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{pp.first, tt.first}]
                                    << " 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}]
                                    << " 1 ~x" << _imp->variable_mappings[pair{q.first, u.first}] << " >= 1 ;\n";
                ++_imp->proof_line;
                _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, t}, pair{q, u}}, _imp->proof_line);
                _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{q, u}, pair{p, t}}, _imp->proof_line);
            }
        }
    }
}